

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::erase
          (InnerMap *this,iterator it)

{
  map<std::reference_wrapper<google::protobuf::MapKey_const>,void*,std::less<google::protobuf::MapKey>,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>>
  *this_00;
  bool bVar1;
  LogMessage *pLVar2;
  Tree *tree;
  LogMessage local_100;
  Node *local_c8;
  Node *head;
  LogMessage local_b8;
  Node *local_80;
  Node *item;
  size_type b;
  _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>
  _Stack_68;
  bool is_list;
  iterator tree_it;
  LogMessage local_48;
  InnerMap *local_10;
  InnerMap *this_local;
  
  local_10 = this;
  if (it.m_ != this) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
               ,0x2d9);
    pLVar2 = internal::LogMessage::operator<<(&local_48,"CHECK failed: (it.m_) == (this): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&tree_it._M_node + 3),pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>
  ::_Rb_tree_iterator(&stack0xffffffffffffff98);
  b._7_1_ = iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
            ::revalidate_if_necessary(&it,&stack0xffffffffffffff98);
  item = (Node *)it.bucket_index_;
  local_80 = it.node_;
  if ((bool)b._7_1_) {
    bVar1 = TableEntryIsNonEmptyList(this,it.bucket_index_);
    head._7_1_ = 0;
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
                 ,0x2df);
      head._7_1_ = 1;
      pLVar2 = internal::LogMessage::operator<<
                         (&local_b8,"CHECK failed: TableEntryIsNonEmptyList(b): ");
      internal::LogFinisher::operator=((LogFinisher *)((long)&head + 6),pLVar2);
    }
    if ((head._7_1_ & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_b8);
    }
    local_c8 = (Node *)this->table_[(long)item];
    local_c8 = EraseFromLinkedList(this,local_80,local_c8);
    this->table_[(long)item] = local_c8;
  }
  else {
    bVar1 = TableEntryIsTree(this,it.bucket_index_);
    tree._7_1_ = 0;
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
                 ,0x2e4);
      tree._7_1_ = 1;
      pLVar2 = internal::LogMessage::operator<<(&local_100,"CHECK failed: TableEntryIsTree(b): ");
      internal::LogFinisher::operator=((LogFinisher *)((long)&tree + 6),pLVar2);
    }
    if ((tree._7_1_ & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_100);
    }
    this_00 = (map<std::reference_wrapper<google::protobuf::MapKey_const>,void*,std::less<google::protobuf::MapKey>,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>>
               *)this->table_[(long)item];
    std::
    map<std::reference_wrapper<google::protobuf::MapKey_const>,void*,std::less<google::protobuf::MapKey>,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>>
    ::erase_abi_cxx11_(this_00,(iterator)_Stack_68._M_node);
    bVar1 = std::
            map<std::reference_wrapper<const_google::protobuf::MapKey>,_void_*,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
            ::empty((map<std::reference_wrapper<const_google::protobuf::MapKey>,_void_*,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
                     *)this_00);
    if (bVar1) {
      item = (Node *)((ulong)item & 0xfffffffffffffffe);
      DestroyTree(this,(Tree *)this_00);
      this->table_[(long)&item->field_0x1] = (void *)0x0;
      this->table_[(long)item] = (void *)0x0;
    }
  }
  DestroyNode(this,local_80);
  this->num_elements_ = this->num_elements_ - 1;
  if (item == (Node *)this->index_of_first_non_null_) {
    while( true ) {
      bVar1 = false;
      if (this->index_of_first_non_null_ < this->num_buckets_) {
        bVar1 = this->table_[this->index_of_first_non_null_] == (void *)0x0;
      }
      if (!bVar1) break;
      this->index_of_first_non_null_ = this->index_of_first_non_null_ + 1;
    }
  }
  return;
}

Assistant:

void erase(iterator it) {
      GOOGLE_DCHECK_EQ(it.m_, this);
      typename Tree::iterator tree_it;
      const bool is_list = it.revalidate_if_necessary(&tree_it);
      size_type b = it.bucket_index_;
      Node* const item = it.node_;
      if (is_list) {
        GOOGLE_DCHECK(TableEntryIsNonEmptyList(b));
        Node* head = static_cast<Node*>(table_[b]);
        head = EraseFromLinkedList(item, head);
        table_[b] = static_cast<void*>(head);
      } else {
        GOOGLE_DCHECK(TableEntryIsTree(b));
        Tree* tree = static_cast<Tree*>(table_[b]);
        tree->erase(tree_it);
        if (tree->empty()) {
          // Force b to be the minimum of b and b ^ 1.  This is important
          // only because we want index_of_first_non_null_ to be correct.
          b &= ~static_cast<size_type>(1);
          DestroyTree(tree);
          table_[b] = table_[b + 1] = nullptr;
        }
      }
      DestroyNode(item);
      --num_elements_;
      if (PROTOBUF_PREDICT_FALSE(b == index_of_first_non_null_)) {
        while (index_of_first_non_null_ < num_buckets_ &&
               table_[index_of_first_non_null_] == nullptr) {
          ++index_of_first_non_null_;
        }
      }
    }